

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O1

IDenseNetwork * __thiscall
IDenseNetwork::Backward(IDenseNetwork *this,vector<float,_std::allocator<float>_> *deltas)

{
  pointer ppIVar1;
  void *local_38;
  undefined8 uStack_30;
  long local_28;
  
  (*(this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
    super__Vector_impl_data._M_finish[-1]->_vptr_ILayer[9])();
  ppIVar1 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish + -1;
  if (ppIVar1 !=
      (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      local_38 = (void *)0x0;
      uStack_30 = 0;
      local_28 = 0;
      (*ppIVar1[-1]->_vptr_ILayer[9])(ppIVar1[-1],&local_38);
      if (local_38 != (void *)0x0) {
        operator_delete(local_38,local_28 - (long)local_38);
      }
      ppIVar1 = ppIVar1 + -1;
    } while (ppIVar1 !=
             (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::Backward( const std::vector<float> &deltas )
{
    layers.back()->Backward( deltas );
    for ( auto it = layers.rbegin() + 1; it != layers.rend(); ++it ) {
        ( *it )->Backward( {} );
    }
    return *this;
}